

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.h
# Opt level: O2

void __thiscall
TPZSkylMatrix<long_double>::TPZSkylMatrix
          (TPZSkylMatrix<long_double> *this,TPZSkylMatrix<long_double> *A)

{
  int64_t iVar1;
  char cVar2;
  
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZBaseMatrix_0168a410;
  iVar1 = (A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow =
       (A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = iVar1;
  cVar2 = (A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDefPositive;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed =
       (A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDefPositive = cVar2;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZSkylMatrix_01688b90;
  TPZVec<long_double_*>::TPZVec(&this->fElem,0);
  TPZVec<long_double>::TPZVec(&this->fStorage,0);
  Copy(this,A);
  return;
}

Assistant:

TPZSkylMatrix(const TPZSkylMatrix<TVar> &A ) : TPZRegisterClassId(&TPZSkylMatrix::ClassId),TPZMatrix<TVar>(A), fElem(0), fStorage(0)  { Copy(A); }